

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void * alloc_large(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  ulong in_RDX;
  int in_ESI;
  long *in_RDI;
  char *data_ptr;
  large_pool_ptr_conflict hdr_ptr;
  my_mem_ptr mem;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  j_common_ptr in_stack_ffffffffffffffd0;
  
  lVar1 = in_RDI[1];
  if (1000000000 < in_RDX) {
    out_of_memory(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  sVar2 = round_up_pow2(in_RDX,0x20);
  if (1000000000 < sVar2 + 0x37) {
    out_of_memory(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  if ((in_ESI < 0) || (1 < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xe;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  puVar3 = (undefined8 *)
           jpeg_get_large(in_stack_ffffffffffffffd0,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (puVar3 == (undefined8 *)0x0) {
    out_of_memory(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  *(size_t *)(lVar1 + 0x98) = sVar2 + 0x37 + *(long *)(lVar1 + 0x98);
  *puVar3 = *(undefined8 *)(lVar1 + 0x78 + (long)in_ESI * 8);
  puVar3[1] = sVar2;
  puVar3[2] = 0;
  *(undefined8 **)(lVar1 + 0x78 + (long)in_ESI * 8) = puVar3;
  puVar3 = puVar3 + 3;
  if (((ulong)puVar3 & 0x1f) != 0) {
    puVar3 = (undefined8 *)((0x20 - ((ulong)puVar3 & 0x1f)) + (long)puVar3);
  }
  return puVar3;
}

Assistant:

METHODDEF(void *)
alloc_large(j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "large" object */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  large_pool_ptr hdr_ptr;
  char *data_ptr;

  /*
   * Round up the requested size to a multiple of ALIGN_SIZE so that
   * algorithms can straddle outside the proper area up to the next
   * alignment.
   */
  if (sizeofobject > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 8);
  }
  sizeofobject = round_up_pow2(sizeofobject, ALIGN_SIZE);

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if ((sizeof(large_pool_hdr) + sizeofobject + ALIGN_SIZE - 1) >
      MAX_ALLOC_CHUNK)
    out_of_memory(cinfo, 3);    /* request exceeds malloc's ability */

  /* Always make a new pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */

  hdr_ptr = (large_pool_ptr)jpeg_get_large(cinfo, sizeofobject +
                                           sizeof(large_pool_hdr) +
                                           ALIGN_SIZE - 1);
  if (hdr_ptr == NULL)
    out_of_memory(cinfo, 4);    /* jpeg_get_large failed */
  mem->total_space_allocated += sizeofobject + sizeof(large_pool_hdr) +
                                ALIGN_SIZE - 1;

  /* Success, initialize the new pool header and add to list */
  hdr_ptr->next = mem->large_list[pool_id];
  /* We maintain space counts in each pool header for statistical purposes,
   * even though they are not needed for allocation.
   */
  hdr_ptr->bytes_used = sizeofobject;
  hdr_ptr->bytes_left = 0;
  mem->large_list[pool_id] = hdr_ptr;

  data_ptr = (char *)hdr_ptr; /* point to first data byte in pool... */
  data_ptr += sizeof(small_pool_hdr); /* ...by skipping the header... */
  if ((size_t)data_ptr % ALIGN_SIZE) /* ...and adjust for alignment */
    data_ptr += ALIGN_SIZE - (size_t)data_ptr % ALIGN_SIZE;

  return (void *)data_ptr;
}